

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgobs.cpp
# Opt level: O3

Am_Wrapper * ship_image_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  Am_Wrapper *pAVar2;
  Am_Image_Array *this_00;
  Am_Object local_10;
  
  Am_Object::Get_Object((ushort)&local_10,(ulong)self);
  this = (Am_Value *)Am_Object::Get((ushort)&local_10,(ulong)SHIP_TYPE);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::~Am_Object(&local_10);
  if (iVar1 == 1) {
    this_00 = (Am_Image_Array *)&SP_Federation_Image;
  }
  else {
    if (iVar1 != 2) {
      return (Am_Wrapper *)0x0;
    }
    this_00 = (Am_Image_Array *)&SP_Klingon_Image;
  }
  pAVar2 = Am_Image_Array::operator_cast_to_Am_Wrapper_(this_00);
  return pAVar2;
}

Assistant:

Am_Define_Image_Formula(ship_image)
{
  SP_Ship_Type st = (int)(self.Get_Owner().Get(SHIP_TYPE));
  if (st == FEDERATION)
    return SP_Federation_Image;
  else if (st == KLINGON)
    return SP_Klingon_Image;
  else {
    //Am_Error("ship_image: Invalid ship type.\n");
    return nullptr;
  }
}